

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  int iVar1;
  Model *this_00;
  pointer pbVar2;
  pointer pcVar3;
  Rep *pRVar4;
  Arena *this_01;
  Result *pRVar5;
  OneHotEncoder *pOVar6;
  StringVector *pSVar7;
  string *elem;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  long *local_58 [2];
  long local_48 [2];
  Result *local_38;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    pOVar6 = (OneHotEncoder *)operator_new(0x28);
    Specification::OneHotEncoder::OneHotEncoder(pOVar6);
    (this_00->Type_).onehotencoder_ = pOVar6;
  }
  pOVar6 = (this_00->Type_).onehotencoder_;
  local_38 = __return_storage_ptr__;
  if (pOVar6->_oneof_case_[0] == 1) {
    if ((pOVar6->CategoryType_).stringcategories_ != (StringVector *)0x0) {
      (*(((pOVar6->CategoryType_).stringcategories_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    pOVar6->_oneof_case_[0] = 0;
  }
  pbVar8 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    pRVar5 = local_38;
    if (pbVar8 == pbVar2) {
      Result::Result(local_38);
      return pRVar5;
    }
    local_58[0] = local_48;
    pcVar3 = (pbVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar3,pcVar3 + pbVar8->_M_string_length);
    if (pOVar6->_oneof_case_[0] != 1) {
      Specification::OneHotEncoder::clear_CategoryType(pOVar6);
      pOVar6->_oneof_case_[0] = 1;
      pSVar7 = (StringVector *)operator_new(0x30);
      Specification::StringVector::StringVector(pSVar7);
      (pOVar6->CategoryType_).stringcategories_ = pSVar7;
    }
    pSVar7 = (pOVar6->CategoryType_).stringcategories_;
    pRVar4 = (pSVar7->vector_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4 == (Rep *)0x0) {
LAB_00271698:
      google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                (&(pSVar7->vector_).super_RepeatedPtrFieldBase,
                 (pSVar7->vector_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002716a7:
      pRVar4 = (pSVar7->vector_).super_RepeatedPtrFieldBase.rep_;
      pRVar4->allocated_size = pRVar4->allocated_size + 1;
      this_01 = (pSVar7->vector_).super_RepeatedPtrFieldBase.arena_;
      if (this_01 == (Arena *)0x0) {
        elem = (string *)operator_new(0x20);
        *(string **)elem = elem + 0x10;
        *(long *)(elem + 8) = 0;
        elem[0x10] = (string)0x0;
      }
      else {
        elem = (string *)
               google::protobuf::Arena::AllocateAligned
                         (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
        *(string **)elem = elem + 0x10;
        *(long *)(elem + 8) = 0;
        elem[0x10] = (string)0x0;
        google::protobuf::Arena::AddListNode
                  (this_01,elem,
                   google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
      }
      pRVar4 = (pSVar7->vector_).super_RepeatedPtrFieldBase.rep_;
      iVar1 = (pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_;
      (pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pRVar4->elements[iVar1] = elem;
    }
    else {
      iVar1 = (pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar4->allocated_size <= iVar1) {
        if (pRVar4->allocated_size == (pSVar7->vector_).super_RepeatedPtrFieldBase.total_size_)
        goto LAB_00271698;
        goto LAB_002716a7;
      }
      (pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (string *)pRVar4->elements[iVar1];
    }
    std::__cxx11::string::_M_assign(elem);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pbVar8 = pbVar8 + 1;
  } while( true );
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<std::string>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_stringcategories();
        
        for (auto element : container) {
            std::string *value = ohe->mutable_stringcategories()->add_vector();
            *value = element;
        }
        return Result();
    }